

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

BOOL SetFileTime(HANDLE hFile,FILETIME *lpCreationTime,FILETIME *lpLastAccessTime,
                FILETIME *lpLastWriteTime)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  UINT64 MAX_FILETIMEVALUE;
  PAL_ERROR palError;
  CPalThread *pThread;
  FILETIME *lpLastWriteTime_local;
  FILETIME *lpLastAccessTime_local;
  FILETIME *lpCreationTime_local;
  HANDLE hFile_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  if ((((lpCreationTime == (FILETIME *)0x0) || ((ulong)*lpCreationTime < 0x8000000000000000)) &&
      ((lpLastAccessTime == (FILETIME *)0x0 || ((ulong)*lpLastAccessTime < 0x8000000000000000)))) &&
     ((lpLastWriteTime == (FILETIME *)0x0 || ((ulong)*lpLastWriteTime < 0x8000000000000000)))) {
    dwLastError = CorUnix::InternalSetFileTime
                            (pThread_00,hFile,lpCreationTime,lpLastAccessTime,lpLastWriteTime);
    if (dwLastError != 0) {
      CorUnix::CPalThread::SetLastError(dwLastError);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    hFile_local._4_4_ = (uint)(dwLastError == 0);
  }
  else {
    CorUnix::CPalThread::SetLastError(6);
    hFile_local._4_4_ = 0;
  }
  return hFile_local._4_4_;
}

Assistant:

BOOL
PALAPI
SetFileTime(
        IN HANDLE hFile,
        IN CONST FILETIME *lpCreationTime,
        IN CONST FILETIME *lpLastAccessTime,
        IN CONST FILETIME *lpLastWriteTime)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    const UINT64 MAX_FILETIMEVALUE = 0x8000000000000000LL;

    PERF_ENTRY(SetFileTime);
    ENTRY("SetFileTime(hFile=%p, lpCreationTime=%p, lpLastAccessTime=%p, "
          "lpLastWriteTime=%p)\n", hFile, lpCreationTime, lpLastAccessTime, 
          lpLastWriteTime);

    pThread = InternalGetCurrentThread();

    /* validate filetime values */
    if ( (lpCreationTime && (((UINT64)lpCreationTime->dwHighDateTime   << 32) + 
          lpCreationTime->dwLowDateTime   >= MAX_FILETIMEVALUE)) ||        
         (lpLastAccessTime && (((UINT64)lpLastAccessTime->dwHighDateTime << 32) + 
          lpLastAccessTime->dwLowDateTime >= MAX_FILETIMEVALUE)) ||
         (lpLastWriteTime && (((UINT64)lpLastWriteTime->dwHighDateTime  << 32) + 
          lpLastWriteTime->dwLowDateTime  >= MAX_FILETIMEVALUE)))
    {
        pThread->SetLastError(ERROR_INVALID_HANDLE);
        return FALSE;
    }

    palError = InternalSetFileTime(
        pThread,
        hFile,
        lpCreationTime,
        lpLastAccessTime,
        lpLastWriteTime
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("SetFileTime returns BOOL %s\n", NO_ERROR == palError ? "TRUE":"FALSE");
    PERF_EXIT(SetFileTime);
    return NO_ERROR == palError;
}